

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

String testing::internal::UnitTestOptions::GetOutputFormat(void)

{
  char *__s;
  char *pcVar1;
  undefined1 *__dest;
  undefined1 *puVar2;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar3;
  char *in_RDI;
  size_t __n;
  String SVar4;
  
  __s = FLAGS_gtest_output;
  if (FLAGS_gtest_output == (char *)0x0) {
    puVar2 = (undefined1 *)operator_new__(1);
    __n = 0;
    sVar3 = extraout_RDX;
    __dest = puVar2;
  }
  else {
    pcVar1 = strchr(FLAGS_gtest_output,0x3a);
    if (pcVar1 == (char *)0x0) {
      __n = strlen(__s);
    }
    else {
      __n = (long)pcVar1 - (long)__s;
    }
    __dest = (undefined1 *)operator_new__(__n + 1);
    memcpy(__dest,__s,__n);
    puVar2 = __dest + __n;
    sVar3 = extraout_RDX_00;
  }
  *puVar2 = 0;
  *(undefined1 **)in_RDI = __dest;
  *(size_t *)(in_RDI + 8) = __n;
  SVar4.length_ = sVar3;
  SVar4.c_str_ = in_RDI;
  return SVar4;
}

Assistant:

String UnitTestOptions::GetOutputFormat() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();
  if (gtest_output_flag == NULL) return String("");

  const char* const colon = strchr(gtest_output_flag, ':');
  return (colon == NULL) ?
      String(gtest_output_flag) :
      String(gtest_output_flag, colon - gtest_output_flag);
}